

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::PopTryCatch(CWriter *this)

{
  bool bVar1;
  CWriter *this_local;
  
  bVar1 = std::
          vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ::empty(&this->try_catch_stack_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!try_catch_stack_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0xa2b,"void wabt::(anonymous namespace)::CWriter::PopTryCatch()");
  }
  std::
  vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
  ::pop_back(&this->try_catch_stack_);
  return;
}

Assistant:

void CWriter::PopTryCatch() {
  assert(!try_catch_stack_.empty());
  try_catch_stack_.pop_back();
}